

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int m_encode_zero(aec_stream *strm)

{
  int iVar1;
  internal_state *state;
  int fs;
  
  state = strm->state;
  emit(state,0,state->id_len + 1);
  if (state->zero_ref != 0) {
    emit(state,state->zero_ref_sample,strm->bits_per_sample);
  }
  iVar1 = state->zero_blocks;
  fs = 4;
  if (iVar1 != -1) {
    fs = iVar1 - (uint)(iVar1 < 5);
  }
  emitfs(state,fs);
  state->zero_blocks = 0;
  m_flush_block(strm);
  return 1;
}

Assistant:

static int m_encode_zero(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    emit(state, 0, state->id_len + 1);

    if (state->zero_ref)
        emit(state, state->zero_ref_sample, strm->bits_per_sample);

    if (state->zero_blocks == ROS)
        emitfs(state, 4);
    else if (state->zero_blocks >= 5)
        emitfs(state, state->zero_blocks);
    else
        emitfs(state, state->zero_blocks - 1);

    state->zero_blocks = 0;
    return m_flush_block(strm);
}